

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
::initPrograms(QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
               *this,SourceCollections *sourceCollections)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  long lVar4;
  ulong uVar5;
  ostringstream source;
  ostringstream src;
  undefined1 auStack_378 [8];
  uint local_370;
  undefined4 uStack_36c;
  value_type local_368;
  long *local_348;
  long local_340;
  long local_338 [2];
  SourceCollections *local_328;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_328 = sourceCollections;
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(binding = 0) writeonly buffer Output {\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tuint values[];\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"} sb_out;\n\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tuvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "\t                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "\t                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
             ,0x89);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tuint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tsb_out.values[index] += index;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  if ((this->m_parameters).
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_parameters).
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      __s = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_378 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1d0);
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_y = ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_z = ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") in;\n",6);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(char *)CONCAT44(uStack_36c,local_370),(long)local_368._M_dataplus._M_p);
      if ((size_type *)CONCAT44(uStack_36c,local_370) != &local_368._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_36c,local_370),local_368._M_string_length + 1)
        ;
      }
      pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                         (&local_328->glslSources,
                          (string *)
                          ((long)(((this->m_parameters).
                                   super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->localSize).m_data +
                          lVar4));
      std::__cxx11::stringbuf::str();
      local_370 = 5;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_348,local_340 + (long)local_348);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pPVar3->sources + local_370,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (local_348 != local_338) {
        operator_delete(local_348,local_338[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (uVar5 < (ulong)(((long)(this->m_parameters).
                                    super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_parameters).
                                    super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		std::ostringstream	source;
		source	<< "layout(binding = 0) writeonly buffer Output {\n"
				<< "	uint values[];\n"
				<< "} sb_out;\n\n"
				<< "void main (void) {\n"
				<< "	uvec3 indexUvec3 = uvec3 (gl_GlobalInvocationID.x,\n"
				<< "	                          gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x,\n"
				<< "	                          gl_GlobalInvocationID.z * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x * gl_WorkGroupSize.y);\n"
				<< "	uint index = indexUvec3.x + indexUvec3.y + indexUvec3.z;\n"
				<< "	sb_out.values[index] += index;\n"
				<< "}\n";

		for(size_t shaderNdx = 0; shaderNdx < m_parameters.size(); ++shaderNdx)
		{
			std::ostringstream	src;
			src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
				<< "layout (local_size_x = " << m_parameters[shaderNdx].localSize.x() << ", local_size_y = " << m_parameters[shaderNdx].localSize.y() << ", local_size_z = " << m_parameters[shaderNdx].localSize.z() << ") in;\n"
				<< source.str();
			sourceCollections.glslSources.add(m_parameters[shaderNdx].shaderName) << glu::ComputeSource(src.str());
		}
	}